

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O0

Node * __thiscall AvlTree::newNode(AvlTree *this,int key)

{
  Node *pNVar1;
  Node *node;
  int key_local;
  AvlTree *this_local;
  
  pNVar1 = (Node *)operator_new(0x20);
  pNVar1->value = key;
  pNVar1->leftChild = (Node *)0x0;
  pNVar1->rightChild = (Node *)0x0;
  pNVar1->height = 1;
  return pNVar1;
}

Assistant:

AvlTree::Node *AvlTree::newNode(int key) {
    auto *node = new Node;
    node->value = key;
    node->leftChild = nullptr;
    node->rightChild = nullptr;
    node->height = 1;  // new node is initially added at leaf
    return node;
}